

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O1

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
bulk_load(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
          *this,V *values,int num_keys,LinearModel<int> *pretrained_model,bool train_with_sample)

{
  ulong uVar1;
  int *piVar2;
  int *piVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  int *piVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  double dVar20;
  LinearModel<int> LVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 in_XMM3_Qb;
  
  uVar19 = (ulong)(uint)num_keys;
  initialize(this,num_keys,0.7);
  if (num_keys == 0) {
    this->expansion_threshold_ = (double)this->data_capacity_;
    this->contraction_threshold_ = 0.0;
    if (0 < this->data_capacity_) {
      piVar12 = this->key_slots_;
      lVar9 = 0;
      do {
        piVar12[lVar9] = 0x7fffffff;
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->data_capacity_);
    }
  }
  else {
    if (pretrained_model == (LinearModel<int> *)0x0) {
      build_model(values,num_keys,&(this->super_AlexNode<int,_int>).model_,train_with_sample);
    }
    else {
      dVar20 = pretrained_model->b_;
      (this->super_AlexNode<int,_int>).model_.a_ = pretrained_model->a_;
      (this->super_AlexNode<int,_int>).model_.b_ = dVar20;
    }
    dVar20 = (double)this->data_capacity_ / (double)num_keys;
    LVar21.a_ = dVar20 * (this->super_AlexNode<int,_int>).model_.a_;
    LVar21.b_ = dVar20 * (this->super_AlexNode<int,_int>).model_.b_;
    (this->super_AlexNode<int,_int>).model_ = LVar21;
    if (num_keys < 1) {
      uVar16 = 0xffffffff;
    }
    else {
      piVar2 = this->key_slots_;
      piVar3 = this->payload_slots_;
      puVar4 = this->bitmap_;
      auVar23 = vshufpd_avx((undefined1  [16])LVar21,(undefined1  [16])LVar21,1);
      piVar12 = &values->second;
      uVar16 = 0xffffffff;
      uVar13 = 0;
      uVar14 = uVar19;
      uVar17 = uVar19;
      do {
        auVar24._0_8_ = (double)values[uVar13].first;
        auVar24._8_8_ = in_XMM3_Qb;
        auVar24 = vfmadd213sd_fma(auVar24,(undefined1  [16])LVar21,auVar23);
        uVar11 = (uint)auVar24._0_8_;
        uVar7 = uVar16 + 1;
        uVar6 = uVar11;
        if ((int)uVar11 < (int)uVar7) {
          uVar6 = uVar7;
        }
        iVar8 = this->data_capacity_;
        uVar15 = (uint)uVar17;
        if ((int)(iVar8 - uVar6) < (int)uVar15) {
          iVar18 = iVar8 - uVar15;
          if ((int)uVar7 < iVar18) {
            lVar9 = (long)(int)uVar16 + 1;
            do {
              piVar2[lVar9] = values[uVar13].first;
              lVar9 = lVar9 + 1;
            } while (lVar9 < iVar18);
          }
          puVar5 = this->bitmap_;
          uVar17 = 0;
          do {
            piVar2[((long)iVar8 + uVar17) - (long)(int)uVar15] = piVar12[uVar17 * 2 + -1];
            piVar3[((long)iVar8 + uVar17) - (long)(int)uVar15] = piVar12[uVar17 * 2];
            if ((iVar18 < 0) ||
               (uVar1 = (long)iVar18 + uVar17, (long)this->data_capacity_ <= (long)uVar1))
            goto LAB_0014067c;
            puVar5[uVar1 >> 6 & 0x3ffffff] = puVar5[uVar1 >> 6 & 0x3ffffff] | 1L << (uVar1 & 0x3f);
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
          uVar16 = (int)uVar17 + ~uVar15 + iVar8;
          uVar7 = uVar15;
        }
        else {
          if ((int)uVar7 < (int)uVar11) {
            lVar10 = (long)(int)uVar16;
            lVar9 = (long)(int)uVar11;
            if ((long)(int)uVar11 < lVar10 + 1) {
              lVar9 = lVar10 + 1;
            }
            do {
              piVar2[lVar10 + 1] = values[uVar13].first;
              lVar10 = lVar10 + 1;
            } while ((int)lVar9 + -1 != (int)lVar10);
          }
          piVar2[(int)uVar6] = values[uVar13].first;
          piVar3[(int)uVar6] = values[uVar13].second;
          if (((int)uVar6 < 0) || (this->data_capacity_ <= (int)uVar6)) {
LAB_0014067c:
            __assert_fail("pos >= 0 && pos < data_capacity_",
                          "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex_nodes.h"
                          ,0x1e4,
                          "void alex::AlexDataNode<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::set_bit(int) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                         );
          }
          puVar4[uVar6 >> 6] = puVar4[uVar6 >> 6] | 1L << ((ulong)uVar6 & 0x3f);
          uVar7 = uVar15 - 1;
          uVar16 = uVar6;
        }
        if ((int)(iVar8 - uVar6) < (int)uVar15) break;
        uVar13 = uVar13 + 1;
        piVar12 = piVar12 + 2;
        uVar14 = uVar14 - 1;
        uVar17 = (ulong)uVar7;
      } while (uVar13 != uVar19);
    }
    iVar8 = this->data_capacity_;
    if ((int)(uVar16 + 1) < iVar8) {
      piVar12 = this->key_slots_;
      lVar9 = (long)(int)uVar16 + 1;
      do {
        piVar12[lVar9] = 0x7fffffff;
        lVar9 = lVar9 + 1;
        iVar8 = this->data_capacity_;
      } while (lVar9 < iVar8);
    }
    auVar22._0_8_ = (double)iVar8;
    auVar22._8_8_ = in_XMM3_Qb;
    auVar25._0_8_ = (double)(num_keys + 1);
    auVar25._8_8_ = in_XMM3_Qb;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auVar22._0_8_ * 0.8;
    auVar23 = vmaxsd_avx(auVar25,auVar23);
    auVar23 = vminsd_avx(auVar22,auVar23);
    this->expansion_threshold_ = auVar23._0_8_;
    this->contraction_threshold_ = auVar22._0_8_ * 0.6;
    this->min_key_ = values->first;
    this->max_key_ = values[(long)num_keys + -1].first;
  }
  return;
}

Assistant:

void bulk_load(const V values[], int num_keys,
                 const LinearModel<T>* pretrained_model = nullptr,
                 bool train_with_sample = false) {
    initialize(num_keys, kInitDensity_);

    if (num_keys == 0) {
      expansion_threshold_ = data_capacity_;
      contraction_threshold_ = 0;
      for (int i = 0; i < data_capacity_; i++) {
        ALEX_DATA_NODE_KEY_AT(i) = kEndSentinel_;
      }
      return;
    }

    // Build model
    if (pretrained_model != nullptr) {
      this->model_.a_ = pretrained_model->a_;
      this->model_.b_ = pretrained_model->b_;
    } else {
      build_model(values, num_keys, &(this->model_), train_with_sample);
    }
    this->model_.expand(static_cast<double>(data_capacity_) / num_keys);

    // Model-based inserts
    int last_position = -1;
    int keys_remaining = num_keys;
    for (int i = 0; i < num_keys; i++) {
      int position = this->model_.predict(values[i].first);
      position = std::max<int>(position, last_position + 1);

      int positions_remaining = data_capacity_ - position;
      if (positions_remaining < keys_remaining) {
        // fill the rest of the store contiguously
        int pos = data_capacity_ - keys_remaining;
        for (int j = last_position + 1; j < pos; j++) {
          ALEX_DATA_NODE_KEY_AT(j) = values[i].first;
        }
        for (int j = i; j < num_keys; j++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
          key_slots_[pos] = values[j].first;
          payload_slots_[pos] = values[j].second;
#else
          data_slots_[pos] = values[j];
#endif
          set_bit(pos);
          pos++;
        }
        last_position = pos - 1;
        break;
      }

      for (int j = last_position + 1; j < position; j++) {
        ALEX_DATA_NODE_KEY_AT(j) = values[i].first;
      }

#if ALEX_DATA_NODE_SEP_ARRAYS
      key_slots_[position] = values[i].first;
      payload_slots_[position] = values[i].second;
#else
      data_slots_[position] = values[i];
#endif
      set_bit(position);

      last_position = position;

      keys_remaining--;
    }

    for (int i = last_position + 1; i < data_capacity_; i++) {
      ALEX_DATA_NODE_KEY_AT(i) = kEndSentinel_;
    }

    expansion_threshold_ = std::min(std::max(data_capacity_ * kMaxDensity_,
                                             static_cast<double>(num_keys + 1)),
                                    static_cast<double>(data_capacity_));
    contraction_threshold_ = data_capacity_ * kMinDensity_;
    min_key_ = values[0].first;
    max_key_ = values[num_keys - 1].first;
  }